

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ya_getopt.cc
# Opt level: O2

void check_gnu_extension(char *optstring)

{
  char cVar1;
  char *pcVar2;
  
  cVar1 = *optstring;
  if (cVar1 == '+') {
    posixly_correct = 1;
  }
  else {
    pcVar2 = getenv("POSIXLY_CORRECT");
    posixly_correct = (int)(pcVar2 != (char *)0x0);
  }
  handle_nonopt_argv = cVar1 == '-';
  return;
}

Assistant:

static void check_gnu_extension(const char *optstring)
{
    if (optstring[0] == '+' || getenv("POSIXLY_CORRECT") != NULL) {
        posixly_correct = 1;
    } else {
        posixly_correct = 0;
    }
    if (optstring[0] == '-') {
        handle_nonopt_argv = 1;
    } else {
        handle_nonopt_argv = 0;
    }
}